

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

void __thiscall wasm::OptimizeInstructions::visitCallRef(OptimizeInstructions *this,CallRef *curr)

{
  FeatureSet features;
  Expression *target;
  Module *module;
  Expression table;
  bool bVar1;
  Index index;
  CallIndirect *rep;
  Expression *pEVar2;
  HeapType HVar3;
  HeapType HVar4;
  Expression **ppEVar5;
  Type TVar6;
  LocalGet *get;
  Block *pBVar7;
  Drop *left;
  Call *right;
  ArenaVector<wasm::Expression_*> *args;
  char *pcVar8;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *this_00;
  Name target_00;
  initializer_list<wasm::Expression_*> local_a8;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  uintptr_t local_70;
  _Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_68;
  ArenaVector<wasm::Expression_*> *local_50;
  Module *local_48;
  Function *local_40;
  Builder local_38;
  Builder builder;
  size_t sVar9;
  
  ppEVar5 = &curr->target;
  skipNonNullCast(this,ppEVar5,(Expression *)curr);
  bVar1 = trapOnNull(this,(Expression *)curr,ppEVar5);
  if (bVar1) {
    return;
  }
  pEVar2 = *ppEVar5;
  if ((pEVar2->type).id == 1) {
    return;
  }
  if (pEVar2->_id == TableGetId) {
    local_68._M_impl.super__Vector_impl_data._M_start =
         (pointer)(this->
                  super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                  ).
                  super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .
                  super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                  .currModule;
    table = pEVar2[1];
    target = *(Expression **)(pEVar2 + 2);
    local_50 = &curr->operands;
    HVar3 = wasm::Type::getHeapType(&pEVar2->type);
    rep = Builder::makeCallIndirect<ArenaVector<wasm::Expression*>>
                    ((Builder *)&local_68,(Name)table,target,local_50,HVar3,curr->isReturn);
  }
  else {
    if (pEVar2->_id == RefFuncId) {
      local_68._M_impl.super__Vector_impl_data._M_start =
           (pointer)(this->
                    super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                    ).
                    super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .
                    super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                    .currModule;
      this_00 = &local_68;
      sVar9 = *(size_t *)(pEVar2 + 1);
      pcVar8 = (char *)pEVar2[1].type.id;
      args = &curr->operands;
      TVar6.id = (curr->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id
      ;
      bVar1 = curr->isReturn;
    }
    else {
      module = (this->
               super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
               ).
               super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .
               super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
               .currModule;
      features.features = (module->features).features;
      pEVar2 = Properties::getFallthrough
                         (pEVar2,&((this->
                                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                   ).super_Pass.runner)->options,module,AllowTeeBrIf);
      if (pEVar2->_id != RefFuncId) {
        local_98._M_unused._M_object = (void *)0x0;
        local_98._8_8_ = 0;
        local_80 = std::
                   _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp:1393:11)>
                   ::_M_invoke;
        local_88 = std::
                   _Function_handler<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/passes/OptimizeInstructions.cpp:1393:11)>
                   ::_M_manager;
        rep = (CallIndirect *)
              CallUtils::convertToDirectCalls<wasm::CallRef>
                        (curr,(function<std::variant<wasm::CallUtils::Unknown,_wasm::CallUtils::Trap,_wasm::CallUtils::Known>_(wasm::Expression_*)>
                               *)&local_98,
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .currFunction,
                         (this->
                         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                         ).
                         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .
                         super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                         .currModule);
        std::_Function_base::~_Function_base((_Function_base *)&local_98);
        if (rep == (CallIndirect *)0x0) {
          return;
        }
        goto LAB_008ed5c8;
      }
      HVar3 = wasm::Type::getHeapType(&(*ppEVar5)->type);
      HVar4 = wasm::Type::getHeapType(&pEVar2->type);
      if (HVar3.id != HVar4.id) {
        return;
      }
      local_38.wasm =
           (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
      if ((curr->operands).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements ==
          0) {
        left = Builder::makeDrop(&local_38,curr->target);
        local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        right = Builder::makeCall(&local_38,(Name)pEVar2[1],
                                  (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *
                                  )&local_68,
                                  (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)56>).
                                        super_Expression.type.id,curr->isReturn);
        pBVar7 = Builder::makeSequence(&local_38,(Expression *)left,(Expression *)right);
        replaceCurrent(this,(Expression *)pBVar7);
        std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
                  (&local_68);
        return;
      }
      local_50 = &curr->operands;
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&local_50->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      local_48 = (Module *)*ppEVar5;
      local_70 = (((Expression *)local_48)->type).id;
      if (local_70 == 1) {
        return;
      }
      bVar1 = TypeUpdating::canHandleAsLocal((Type)local_70);
      if (!bVar1) {
        return;
      }
      local_40 = (this->
                 super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                 ).
                 super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .
                 super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                 .currFunction;
      TVar6 = TypeUpdating::getValidLocalType(local_70,features);
      index = Builder::addVar(local_40,TVar6);
      local_48 = (Module *)Builder::makeLocalSet(&local_38,index,(Expression *)local_48);
      local_40 = (Function *)Builder::makeDrop(&local_38,curr->target);
      get = MixedArena::alloc<wasm::LocalGet>(&(local_38.wasm)->allocator);
      get->index = index;
      (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = local_70;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)TypeUpdating::fixLocalGet
                              (get,(this->
                                   super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                                   ).
                                   super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .
                                   super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                                   .currModule);
      local_a8._M_array = (iterator)&local_68;
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)local_48;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)local_40;
      local_a8._M_len = 3;
      pBVar7 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                         (&local_38,&local_a8);
      args = local_50;
      ppEVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          (&local_50->
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          );
      *ppEVar5 = (Expression *)pBVar7;
      sVar9 = *(size_t *)(pEVar2 + 1);
      pcVar8 = (char *)pEVar2[1].type.id;
      TVar6.id = (curr->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id
      ;
      bVar1 = curr->isReturn;
      this_00 = (_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&local_38;
    }
    target_00.super_IString.str._M_str = pcVar8;
    target_00.super_IString.str._M_len = sVar9;
    rep = (CallIndirect *)
          Builder::makeCall<ArenaVector<wasm::Expression*>>
                    ((Builder *)this_00,target_00,args,TVar6,bVar1);
  }
LAB_008ed5c8:
  replaceCurrent(this,(Expression *)rep);
  return;
}

Assistant:

void visitCallRef(CallRef* curr) {
    skipNonNullCast(curr->target, curr);
    if (trapOnNull(curr, curr->target)) {
      return;
    }
    if (curr->target->type == Type::unreachable) {
      // The call_ref is not reached; leave this for DCE.
      return;
    }

    if (auto* ref = curr->target->dynCast<RefFunc>()) {
      // We know the target!
      replaceCurrent(
        Builder(*getModule())
          .makeCall(ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    if (auto* get = curr->target->dynCast<TableGet>()) {
      // (call_ref ..args.. (table.get $table (index))
      //   =>
      // (call_indirect $table ..args.. (index))
      replaceCurrent(Builder(*getModule())
                       .makeCallIndirect(get->table,
                                         get->index,
                                         curr->operands,
                                         get->type.getHeapType(),
                                         curr->isReturn));
      return;
    }

    auto features = getModule()->features;

    // It is possible the target is not a function reference, but we can infer
    // the fallthrough value there. It takes more work to optimize this case,
    // but it is pretty important to allow a call_ref to become a fast direct
    // call, so make the effort.
    if (auto* ref = Properties::getFallthrough(
                      curr->target, getPassOptions(), *getModule())
                      ->dynCast<RefFunc>()) {
      // Check if the fallthrough make sense. We may have cast it to a different
      // type, which would be a problem - we'd be replacing a call_ref to one
      // type with a direct call to a function of another type. That would trap
      // at runtime; be careful not to emit invalid IR here.
      if (curr->target->type.getHeapType() != ref->type.getHeapType()) {
        return;
      }
      Builder builder(*getModule());
      if (curr->operands.empty()) {
        // No operands, so this is simple and there is nothing to reorder: just
        // emit:
        //
        // (block
        //  (drop curr->target)
        //  (call ref.func-from-curr->target)
        // )
        replaceCurrent(builder.makeSequence(
          builder.makeDrop(curr->target),
          builder.makeCall(ref->func, {}, curr->type, curr->isReturn)));
        return;
      }

      // In the presence of operands, we must execute the code in curr->target
      // after the last operand and before the call happens. Interpose at the
      // last operand:
      //
      // (call ref.func-from-curr->target)
      //  (operand1)
      //  (..)
      //  (operandN-1)
      //  (block
      //   (local.set $temp (operandN))
      //   (drop curr->target)
      //   (local.get $temp)
      //  )
      // )
      auto* lastOperand = curr->operands.back();
      auto lastOperandType = lastOperand->type;
      if (lastOperandType == Type::unreachable) {
        // The call_ref is not reached; leave this for DCE.
        return;
      }
      if (!TypeUpdating::canHandleAsLocal(lastOperandType)) {
        // We cannot create a local, so we must give up.
        return;
      }
      Index tempLocal = builder.addVar(
        getFunction(),
        TypeUpdating::getValidLocalType(lastOperandType, features));
      auto* set = builder.makeLocalSet(tempLocal, lastOperand);
      auto* drop = builder.makeDrop(curr->target);
      auto* get = TypeUpdating::fixLocalGet(
        builder.makeLocalGet(tempLocal, lastOperandType), *getModule());
      curr->operands.back() = builder.makeBlock({set, drop, get});
      replaceCurrent(builder.makeCall(
        ref->func, curr->operands, curr->type, curr->isReturn));
      return;
    }

    // If the target is a select of two different constants, we can emit an if
    // over two direct calls.
    if (auto* calls = CallUtils::convertToDirectCalls(
          curr,
          [](Expression* target) -> CallUtils::IndirectCallInfo {
            if (auto* refFunc = target->dynCast<RefFunc>()) {
              return CallUtils::Known{refFunc->func};
            }
            return CallUtils::Unknown{};
          },
          *getFunction(),
          *getModule())) {
      replaceCurrent(calls);
    }
  }